

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

char * Scl_LibertyReadDefaultWireLoadSel(Scl_Tree_t *p)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  
  pSVar2 = p->pItems;
  uVar3 = pSVar2->Child;
  iVar1 = p->nItems;
  if ((int)uVar3 < iVar1) {
    if (-1 < (int)uVar3) {
      pcVar6 = p->pContents;
      do {
        iVar5 = pSVar2[uVar3].Key.Beg;
        iVar4 = pSVar2[uVar3].Key.End - iVar5;
        iVar5 = strncmp(pcVar6 + iVar5,"default_wire_load_selection",(long)iVar4);
        if (iVar4 == 0x1b && iVar5 == 0) {
          pcVar6 = Scl_LibertyReadString(p,pSVar2[uVar3].Head);
          return pcVar6;
        }
        uVar3 = pSVar2[uVar3].Next;
        if (iVar1 <= (int)uVar3) goto LAB_0046050e;
      } while ((-1 < (int)uVar3) && (pSVar2 != (Scl_Item_t *)0x0));
    }
    return "";
  }
LAB_0046050e:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                ,0x4d,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

char * Scl_LibertyReadDefaultWireLoadSel( Scl_Tree_t * p )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "default_wire_load_selection" )
        return Scl_LibertyReadString(p, pItem->Head);
    return "";
}